

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O2

void __thiscall tcu::ThreadUtil::Object::~Object(Object *this)

{
  ~Object(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

Object::~Object	(void)
{
}